

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O2

void __thiscall discordpp::ThreadMember::~ThreadMember(ThreadMember *this)

{
  std::unique_ptr<discordpp::GuildMember,_std::default_delete<discordpp::GuildMember>_>::~unique_ptr
            (&(this->member).super_field<discordpp::GuildMember>.t_);
  std::unique_ptr<int,_std::default_delete<int>_>::~unique_ptr(&(this->flags).t_);
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&(this->join_timestamp).t_);
  std::unique_ptr<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>::~unique_ptr
            (&(this->user_id).super_field<discordpp::Snowflake>.t_);
  std::unique_ptr<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>::~unique_ptr
            (&(this->id).super_field<discordpp::Snowflake>.t_);
  return;
}

Assistant:

ThreadMember(
        omittable_field<Snowflake> id = omitted,
        omittable_field<Snowflake> user_id = omitted,
        field<Timestamp> join_timestamp = uninitialized,
        field<int> flags = uninitialized,
        omittable_field<GuildMember> member = omitted
    ):
        id(id),
        user_id(user_id),
        join_timestamp(join_timestamp),
        flags(flags),
        member(member)
    {}